

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall
minja::UnaryOpExpr::do_evaluate
          (Value *__return_storage_ptr__,UnaryOpExpr *this,shared_ptr<minja::Context> *context)

{
  Expression *this_00;
  runtime_error *prVar1;
  bool local_61;
  Value e;
  
  this_00 = (this->expr).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (Expression *)0x0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"UnaryOpExpr.expr is null");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Expression::evaluate(&e,this_00,context);
  switch(this->op) {
  case Plus:
    Value::Value(__return_storage_ptr__,&e);
    break;
  case Minus:
    Value::operator-(__return_storage_ptr__,&e);
    break;
  case LogicalNot:
    local_61 = Value::to_bool(&e);
    local_61 = !local_61;
    Value::Value(__return_storage_ptr__,&local_61);
    break;
  case Expansion:
  case ExpansionDict:
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar1,"Expansion operator is only supported in function calls and collections");
    goto LAB_001a8728;
  default:
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Unknown unary operator");
LAB_001a8728:
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Value::~Value(&e);
  return __return_storage_ptr__;
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!expr) throw std::runtime_error("UnaryOpExpr.expr is null");
        auto e = expr->evaluate(context);
        switch (op) {
            case Op::Plus: return e;
            case Op::Minus: return -e;
            case Op::LogicalNot: return !e.to_bool();
            case Op::Expansion:
            case Op::ExpansionDict:
                throw std::runtime_error("Expansion operator is only supported in function calls and collections");

        }
        throw std::runtime_error("Unknown unary operator");
    }